

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

limits * nuraft::raft_server::get_raft_limits(void)

{
  limits *in_RDI;
  limits *in_stack_ffffffffffffffe8;
  
  limits::limits(in_RDI,in_stack_ffffffffffffffe8);
  return in_RDI;
}

Assistant:

raft_server::limits raft_server::get_raft_limits() {
    return raft_limits_;
}